

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  RawBufferView *pRVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  size_t sVar3;
  char *pcVar4;
  PrimRef *pPVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  ulong uVar8;
  size_t sVar9;
  undefined4 uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  size_t *psVar14;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  size_t local_50;
  size_t local_48;
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar13 = r->_begin;
  auVar17._8_4_ = 0x7f800000;
  auVar17._0_8_ = 0x7f8000007f800000;
  auVar17._12_4_ = 0x7f800000;
  auVar18 = ZEXT1664(auVar17);
  auVar15._8_4_ = 0xff800000;
  auVar15._0_8_ = 0xff800000ff800000;
  auVar15._12_4_ = 0xff800000;
  auVar16 = ZEXT1664(auVar15);
  local_48 = 0;
  auVar19._8_4_ = 0xddccb9a2;
  auVar19._0_8_ = 0xddccb9a2ddccb9a2;
  auVar19._12_4_ = 0xddccb9a2;
  auVar20._8_4_ = 0x5dccb9a2;
  auVar20._0_8_ = 0x5dccb9a25dccb9a2;
  auVar20._12_4_ = 0x5dccb9a2;
  auVar21 = ZEXT1664(auVar15);
  auVar22 = ZEXT1664(auVar17);
  local_50 = k;
LAB_00bf4cae:
  if (r->_end <= uVar13) {
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = auVar22._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = auVar21._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = auVar18._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = auVar16._0_16_;
    __return_storage_ptr__->end = local_48;
    return __return_storage_ptr__;
  }
  uVar12 = uVar13 & 0xffffffff;
  pBVar2 = (this->super_Points).vertices.items;
  if (uVar12 < (pBVar2->super_RawBufferView).num) {
    psVar14 = &pBVar2[itime].super_RawBufferView.stride;
    uVar8 = itime - 1;
    do {
      uVar8 = uVar8 + 1;
      if (itime < uVar8) {
        psVar14 = &pBVar2[itime + 1].super_RawBufferView.stride;
        sVar9 = itime;
        goto LAB_00bf4d1f;
      }
      pRVar1 = (RawBufferView *)(psVar14 + -2);
      sVar9 = *psVar14;
      if (*(float *)(pRVar1->ptr_ofs + sVar9 * uVar12 + 0xc) < 0.0) break;
      psVar14 = psVar14 + 7;
      auVar15 = *(undefined1 (*) [16])(pRVar1->ptr_ofs + sVar9 * uVar12);
      auVar17 = vcmpps_avx(auVar15,auVar19,2);
      auVar15 = vcmpps_avx(auVar15,auVar20,5);
      auVar15 = vorps_avx(auVar17,auVar15);
      uVar10 = vmovmskps_avx(auVar15);
    } while ((char)uVar10 == '\0');
  }
  goto LAB_00bf4d0e;
  while( true ) {
    pRVar1 = (RawBufferView *)(psVar14 + -2);
    sVar3 = *psVar14;
    if (*(float *)(pRVar1->ptr_ofs + sVar3 * uVar12 + 0xc) < 0.0) break;
    psVar14 = psVar14 + 7;
    auVar15 = *(undefined1 (*) [16])(pRVar1->ptr_ofs + sVar3 * uVar12);
    auVar17 = vcmpps_avx(auVar15,auVar19,2);
    auVar15 = vcmpps_avx(auVar15,auVar20,5);
    auVar15 = vorps_avx(auVar17,auVar15);
    uVar10 = vmovmskps_avx(auVar15);
    if ((char)uVar10 != '\0') break;
LAB_00bf4d1f:
    sVar9 = sVar9 + 1;
    if (itime + 1 < sVar9) {
      pcVar4 = pBVar2[itime].super_RawBufferView.ptr_ofs;
      lVar11 = pBVar2[itime].super_RawBufferView.stride * uVar13;
      auVar15 = *(undefined1 (*) [16])(pcVar4 + lVar11);
      auVar17 = ZEXT416((uint)(*(float *)(pcVar4 + lVar11 + 0xc) *
                              (this->super_Points).maxRadiusScale));
      auVar17 = vshufps_avx(auVar17,auVar17,0);
      auVar23 = vsubps_avx(auVar15,auVar17);
      aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar23,ZEXT416(geomID),0x30);
      auVar23._0_4_ = auVar15._0_4_ + auVar17._0_4_;
      auVar23._4_4_ = auVar15._4_4_ + auVar17._4_4_;
      auVar23._8_4_ = auVar15._8_4_ + auVar17._8_4_;
      auVar23._12_4_ = auVar15._12_4_ + auVar17._12_4_;
      aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar23,ZEXT416((uint)uVar13),0x30);
      auVar15 = vminps_avx((undefined1  [16])auVar22._0_16_,(undefined1  [16])aVar6);
      auVar22 = ZEXT1664(auVar15);
      auVar15 = vmaxps_avx((undefined1  [16])auVar21._0_16_,(undefined1  [16])aVar7);
      auVar21 = ZEXT1664(auVar15);
      auVar24._0_4_ = aVar6.x + aVar7.x;
      auVar24._4_4_ = aVar6.y + aVar7.y;
      auVar24._8_4_ = aVar6.z + aVar7.z;
      auVar24._12_4_ = aVar6.field_3.w + aVar7.field_3.w;
      auVar15 = vminps_avx((undefined1  [16])auVar18._0_16_,auVar24);
      auVar18 = ZEXT1664(auVar15);
      auVar15 = vmaxps_avx((undefined1  [16])auVar16._0_16_,auVar24);
      auVar16 = ZEXT1664(auVar15);
      local_48 = local_48 + 1;
      pPVar5 = prims->items;
      pPVar5[local_50].upper.field_0.field_1 = aVar7;
      pPVar5[local_50].lower.field_0.field_1 = aVar6;
      local_50 = local_50 + 1;
      break;
    }
  }
LAB_00bf4d0e:
  uVar13 = uVar13 + 1;
  goto LAB_00bf4cae;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, itime, bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }